

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend_tests.cpp
# Opt level: O0

void wallet::spend_tests::SubtractFee_invoker(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_wrap_stringstream<char> *msg;
  basic_wrap_stringstream<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  long in_FS_OFFSET;
  SubtractFee t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff158;
  std_string *in_stack_fffffffffffff160;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff168;
  SubtractFee *in_stack_fffffffffffff178;
  const_string *in_stack_fffffffffffff180;
  size_t in_stack_fffffffffffff188;
  undefined1 *__s;
  const_string *in_stack_fffffffffffff190;
  const_string *pcVar1;
  unit_test_log_t *in_stack_fffffffffffff198;
  undefined1 local_cb0 [408];
  undefined1 local_b18 [408];
  undefined1 local_980 [408];
  undefined1 local_7e8 [1608];
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,
             (pointer)in_stack_fffffffffffff160,(unsigned_long)in_stack_fffffffffffff158);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff158);
  boost::operator<<(in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [12])in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [15])in_stack_fffffffffffff160);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff168);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190,in_stack_fffffffffffff188,
             in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff158);
  SubtractFee::SubtractFee(in_stack_fffffffffffff178);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,
             (pointer)in_stack_fffffffffffff160,(unsigned_long)in_stack_fffffffffffff158);
  memset(local_7e8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff158);
  boost::operator<<(in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [12])in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [16])in_stack_fffffffffffff160);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff168);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190,in_stack_fffffffffffff188,
             in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::unit_test::setup_conditional<wallet::spend_tests::SubtractFee>((SubtractFee *)0xe1360e);
  pcVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,
             (pointer)in_stack_fffffffffffff160,(unsigned_long)in_stack_fffffffffffff158);
  memset(local_980,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff158);
  boost::operator<<(in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [12])in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [13])in_stack_fffffffffffff160);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff168);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190,in_stack_fffffffffffff188,
             in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff158);
  SubtractFee::test_method((SubtractFee *)pcVar1);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,
             (pointer)in_stack_fffffffffffff160,(unsigned_long)in_stack_fffffffffffff158);
  memset(local_b18,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff158);
  boost::operator<<(in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [12])in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [19])in_stack_fffffffffffff160);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff168);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,in_stack_fffffffffffff190,in_stack_fffffffffffff188,
             in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::unit_test::teardown_conditional<wallet::spend_tests::SubtractFee>((SubtractFee *)0xe13858);
  pcVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,
             (pointer)in_stack_fffffffffffff160,(unsigned_long)in_stack_fffffffffffff158);
  __s = local_cb0;
  memset(__s,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff158);
  msg = boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff158);
  boost::operator<<(in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [12])in_stack_fffffffffffff160);
  this_00 = boost::operator<<(in_stack_fffffffffffff168,(char (*) [15])in_stack_fffffffffffff160);
  s = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_00);
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00,s)
  ;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,pcVar1,(size_t)__s,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff158);
  SubtractFee::~SubtractFee((SubtractFee *)in_stack_fffffffffffff158);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(SubtractFee, TestChain100Setup)
{
    CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey()));
    auto wallet = CreateSyncedWallet(*m_node.chain, WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain()), coinbaseKey);

    // Check that a subtract-from-recipient transaction slightly less than the
    // coinbase input amount does not create a change output (because it would
    // be uneconomical to add and spend the output), and make sure it pays the
    // leftover input amount which would have been change to the recipient
    // instead of the miner.
    auto check_tx = [&wallet](CAmount leftover_input_amount) {
        CRecipient recipient{PubKeyDestination({}), 50 * COIN - leftover_input_amount, /*subtract_fee=*/true};
        CCoinControl coin_control;
        coin_control.m_feerate.emplace(10000);
        coin_control.fOverrideFeeRate = true;
        // We need to use a change type with high cost of change so that the leftover amount will be dropped to fee instead of added as a change output
        coin_control.m_change_type = OutputType::LEGACY;
        auto res = CreateTransaction(*wallet, {recipient}, /*change_pos=*/std::nullopt, coin_control);
        BOOST_CHECK(res);
        const auto& txr = *res;
        BOOST_CHECK_EQUAL(txr.tx->vout.size(), 1);
        BOOST_CHECK_EQUAL(txr.tx->vout[0].nValue, recipient.nAmount + leftover_input_amount - txr.fee);
        BOOST_CHECK_GT(txr.fee, 0);
        return txr.fee;
    };

    // Send full input amount to recipient, check that only nonzero fee is
    // subtracted (to_reduce == fee).
    const CAmount fee{check_tx(0)};

    // Send slightly less than full input amount to recipient, check leftover
    // input amount is paid to recipient not the miner (to_reduce == fee - 123)
    BOOST_CHECK_EQUAL(fee, check_tx(123));

    // Send full input minus fee amount to recipient, check leftover input
    // amount is paid to recipient not the miner (to_reduce == 0)
    BOOST_CHECK_EQUAL(fee, check_tx(fee));

    // Send full input minus more than the fee amount to recipient, check
    // leftover input amount is paid to recipient not the miner (to_reduce ==
    // -123). This overpays the recipient instead of overpaying the miner more
    // than double the necessary fee.
    BOOST_CHECK_EQUAL(fee, check_tx(fee + 123));
}